

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

BOOL place_landmarks(dw_map *map)

{
  byte bVar1;
  bool bVar2;
  BOOL BVar3;
  dw_border_tile dVar4;
  dw_warp *pdVar5;
  ulong local_468;
  dw_warp_index caves [8];
  dw_warp *warp;
  BOOL swamp_placed;
  uint8_t charlock_lm;
  BOOL BStack_434;
  uint8_t tantegel_lm;
  int brecc_lm2;
  int brecc_lm1;
  int rimuldar_lm2;
  int rimuldar_lm1;
  int lm_sizes [256];
  BOOL local_20;
  int next;
  int largest;
  int i;
  dw_map *map_local;
  
  local_20 = FALSE;
  lm_sizes[0xff] = 0;
  bVar2 = false;
  local_468 = 0x700000005;
  caves[0] = WARP_STAFF_SHRINE;
  caves[1] = WARP_MOUNTAIN_CAVE;
  caves[2] = WARP_JERK_CAVE;
  caves[3] = WARP_ERDRICKS_CAVE;
  caves[4] = WARP_TANTEGEL_BASEMENT;
  caves[5] = WARP_GARINS_GRAVE;
  _largest = map;
  find_walkable_area(map,&rimuldar_lm2,(int *)&local_20,lm_sizes + 0xff);
  caves._24_8_ = _largest->warps_from + 6;
  place_charlock(_largest,local_20,lm_sizes[0xff]);
  find_walkable_area(_largest,&rimuldar_lm2,(int *)&local_20,lm_sizes + 0xff);
  bVar1 = _largest->walkable[(int)(*(byte *)(caves._24_8_ + 1) + 3)][*(byte *)(caves._24_8_ + 2)];
  if ((((*_largest->flags & 3) == 0) || (bVar1 == local_20)) || ((uint)bVar1 == lm_sizes[0xff])) {
    mt_shuffle(&local_468,8,4);
    pdVar5 = _largest->warps_from + (local_468 & 0xffffffff);
    pdVar5->map = '\x04';
    pdVar5->x = '\x1d';
    pdVar5->y = '\x1d';
    caves._24_8_ = _largest->warps_from + (local_468 >> 0x20);
    ((dw_warp *)caves._24_8_)->map = '\t';
    ((dw_warp *)caves._24_8_)->x = '\x13';
    ((dw_warp *)caves._24_8_)->y = '\0';
    for (next = 2; next < 8; next = next + 1) {
      if ((caves[(long)next + -2] == WARP_SWAMP_NORTH) ||
         (caves[(long)next + -2] == WARP_SWAMP_SOUTH)) {
        if (bVar2) {
          place(_largest,caves[(long)next + -2],TILE_CAVE,local_20,0);
        }
        else {
          place(_largest,caves[(long)next + -2],TILE_CAVE,lm_sizes[0xff],0);
          bVar2 = true;
        }
      }
      else {
        place(_largest,caves[(long)next + -2],TILE_CAVE,local_20,lm_sizes[0xff]);
      }
    }
    BStack_434 = local_20;
    brecc_lm1 = local_20;
    swamp_placed = lm_sizes[0xff];
    brecc_lm2 = lm_sizes[0xff];
    BVar3 = swamp_cave_in(_largest,'\0');
    if (BVar3 == FALSE) {
      dVar4 = place(_largest,WARP_GARINHAM,TILE_TOWN,local_20,lm_sizes[0xff]);
      _largest->meta[9].border = (uint8_t)dVar4;
    }
    else if (bVar2) {
      dVar4 = place(_largest,WARP_GARINHAM,TILE_TOWN,local_20,0);
      _largest->meta[9].border = (uint8_t)dVar4;
    }
    else {
      dVar4 = place(_largest,WARP_GARINHAM,TILE_TOWN,lm_sizes[0xff],0);
      _largest->meta[9].border = (uint8_t)dVar4;
      bVar2 = true;
    }
    BVar3 = swamp_cave_in(_largest,'\x04');
    if (BVar3 == FALSE) {
      warp._7_1_ = place_tantegel(_largest,local_20,lm_sizes[0xff]);
    }
    else {
      if (bVar2) {
        warp._7_1_ = place_tantegel(_largest,local_20,0);
      }
      else {
        warp._7_1_ = place_tantegel(_largest,lm_sizes[0xff],0);
      }
      swamp_placed = (BOOL)warp._7_1_;
      BStack_434 = swamp_placed;
    }
    BVar3 = need_rimuldar(_largest);
    if (BVar3 != FALSE) {
      brecc_lm2 = (int)warp._7_1_;
      brecc_lm1 = brecc_lm2;
    }
    dVar4 = place(_largest,WARP_RIMULDAR,TILE_TOWN,brecc_lm1,brecc_lm2);
    _largest->meta[0xb].border = (uint8_t)dVar4;
    dVar4 = place(_largest,WARP_BRECCONARY,TILE_TOWN,BStack_434,swamp_placed);
    _largest->meta[8].border = (uint8_t)dVar4;
    dVar4 = place(_largest,WARP_KOL,TILE_TOWN,local_20,lm_sizes[0xff]);
    _largest->meta[7].border = (uint8_t)dVar4;
    dVar4 = place(_largest,WARP_HAUKSNESS,TILE_TOWN,local_20,lm_sizes[0xff]);
    _largest->meta[3].border = (uint8_t)dVar4;
    dVar4 = place(_largest,WARP_CANTLIN,TILE_TOWN,local_20,lm_sizes[0xff]);
    _largest->meta[10].border = (uint8_t)dVar4;
    map_local._4_4_ = TRUE;
  }
  else {
    printf("Charlock is obstructed, retrying...\n");
    map_local._4_4_ = FALSE;
  }
  return map_local._4_4_;
}

Assistant:

static BOOL place_landmarks(dw_map *map)
{
    int i, largest = 0, next = 0, lm_sizes[256],
            rimuldar_lm1, rimuldar_lm2, brecc_lm1, brecc_lm2;
    uint8_t tantegel_lm, charlock_lm;
    BOOL swamp_placed = FALSE;
    dw_warp *warp;
    dw_warp_index caves[8] = {
            WARP_SWAMP_NORTH,
            WARP_SWAMP_SOUTH,
            WARP_STAFF_SHRINE,
            WARP_MOUNTAIN_CAVE,
            WARP_JERK_CAVE,
            WARP_ERDRICKS_CAVE,
            WARP_TANTEGEL_BASEMENT,
            WARP_GARINS_GRAVE
    };


    /* find the 2 largest land masses */
    find_walkable_area(map, lm_sizes, &largest, &next);


    warp = &map->warps_from[WARP_CHARLOCK];
    place_charlock(map, largest, next);
    find_walkable_area(map, lm_sizes, &largest, &next);
    charlock_lm = map->walkable[warp->x+3][warp->y];

    if (RANDOM_MAP(map)) {
        if (charlock_lm != largest && charlock_lm != next) {
            printf("Charlock is obstructed, retrying...\n");
            return FALSE;
        }
    }

    mt_shuffle(caves, 8, sizeof(dw_warp_index));

    /* place the first two caves in tantegel & garinham */
    warp = &map->warps_from[caves[0]];
    warp->map = TANTEGEL;
    warp->x = 29;
    warp->y = 29;
    warp = &map->warps_from[caves[1]];
    warp->map = GARINHAM;
    warp->x = 19;
    warp->y = 0;


    /* place the remaining caves */
    for (i=2; i < 8; i++) {
        /* make sure the swamp cave entrances are on different land masses */
        if (caves[i] == WARP_SWAMP_NORTH || caves[i] == WARP_SWAMP_SOUTH) {
            if (!swamp_placed) {
                place(map, caves[i], TILE_CAVE, next, 0);
                swamp_placed = TRUE;
            } else {
                place(map, caves[i], TILE_CAVE, largest, 0);
            }
        } else {
            place(map, caves[i], TILE_CAVE, largest, next);
        }
    }
    rimuldar_lm1 = brecc_lm1 = largest;
    rimuldar_lm2 = brecc_lm2 = next;

    /* check for swamp cave to be in garinham */
    if (swamp_cave_in(map, WARP_GARINHAM)) {
        if (swamp_placed) {
            map->meta[GARINHAM].border =
                    place(map, WARP_GARINHAM, TILE_TOWN, largest, 0);
        } else {
            map->meta[GARINHAM].border =
                    place(map, WARP_GARINHAM, TILE_TOWN, next, 0);
            swamp_placed = TRUE;
        }
    } else {
        map->meta[GARINHAM].border =
                place(map, WARP_GARINHAM, TILE_TOWN, largest, next);
    }
    /* check for swamp cave to be in tantegel */
    if (swamp_cave_in(map, WARP_TANTEGEL)) {
        if (swamp_placed) {
            tantegel_lm = place_tantegel(map, largest, 0);
        } else {
            tantegel_lm = place_tantegel(map, next, 0);
            swamp_placed = TRUE;
        }
        /* brecconary on the same land mass as tantegel (for uncursing) */
        brecc_lm1 = brecc_lm2 = (int)tantegel_lm;
    } else {
        tantegel_lm = place_tantegel(map, largest, next);
    }

    if (need_rimuldar(map)) {
        /* rimuldar needs to be on the same land mass as tantegel (for keys) */
        rimuldar_lm1 = rimuldar_lm2 = tantegel_lm;
    }

    map->meta[RIMULDAR].border =
            place(map, WARP_RIMULDAR, TILE_TOWN, rimuldar_lm1, rimuldar_lm2);
    map->meta[BRECCONARY].border =
            place(map, WARP_BRECCONARY, TILE_TOWN, brecc_lm1, brecc_lm2);

    map->meta[KOL].border =
            place(map, WARP_KOL, TILE_TOWN, largest, next);
    map->meta[HAUKSNESS].border =
            place(map, WARP_HAUKSNESS, TILE_TOWN, largest, next);
    map->meta[CANTLIN].border =
            place(map, WARP_CANTLIN, TILE_TOWN, largest, next);

    return TRUE;
}